

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int print_hex_vals(char *data,int nbytes,FILE *fp)

{
  int local_2c;
  int c;
  FILE *fp_local;
  int nbytes_local;
  char *data_local;
  
  if (((data == (char *)0x0) || (nbytes < 1)) || (fp == (FILE *)0x0)) {
    data_local._4_4_ = -1;
  }
  else {
    fputs("0x",(FILE *)fp);
    for (local_2c = 0; local_2c < nbytes; local_2c = local_2c + 1) {
      fprintf((FILE *)fp," %x",(ulong)(uint)(int)data[local_2c]);
    }
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

static int print_hex_vals( const char * data, int nbytes, FILE * fp )
{
   int c;

   if ( !data || nbytes < 1 || !fp ) return -1;

   fputs("0x", fp);
   for ( c = 0; c < nbytes; c++ )
      fprintf(fp, " %x", data[c]);

   return 0;
}